

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::LinkedModel::Clear(LinkedModel *this)

{
  clear_LinkType(this);
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void LinkedModel::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.LinkedModel)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  clear_LinkType();
  _internal_metadata_.Clear<std::string>();
}